

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

C * __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t length,bool saveContents
          )

{
  C *src;
  size_t sVar1;
  BufHdr *pBVar2;
  BufHdr *pBVar3;
  ulong uVar4;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  sVar1 = length + 1;
  pBVar2 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
  if (((pBVar2 != (BufHdr *)0x0) && (uVar4 = pBVar2->m_bufferSize, sVar1 <= uVar4)) &&
     ((pBVar2->super_RefCount).m_refCount == 1)) {
    if (saveContents &&
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length != 0) {
      pBVar3 = (BufHdr *)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p;
    }
    else {
      pBVar3 = pBVar2 + 1;
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)pBVar3;
    }
    if (sVar1 <= (long)pBVar2 + (uVar4 - (long)pBVar3) + 0x28) {
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = length;
      *(undefined1 *)((long)&(pBVar3->super_RefCount)._vptr_RefCount + length) = 0;
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_isNullTerminated = true
      ;
      return (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p;
    }
  }
  sVar1 = getAllocSize<4096ul>(sVar1);
  pBVar2 = (BufHdr *)mem::allocate(sVar1 + 0x28);
  (pBVar2->super_RefCount).m_refCount = 0;
  (pBVar2->super_RefCount).m_weakRefCount = 1;
  (pBVar2->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00198a88;
  pBVar2->m_bufferSize = sVar1;
  pBVar2->m_flags = 0;
  (pBVar2->super_RefCount).m_freeFunc = mem::deallocate;
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_38,pBVar2);
  if (local_38.m_p == (BufHdr *)0x0) {
    pBVar2 = (BufHdr *)0x0;
  }
  else {
    pBVar2 = local_38.m_p + 1;
    src = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p;
    if (saveContents && src != (C *)0x0) {
      uVar4 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
      if (length <= uVar4) {
        uVar4 = length;
      }
      __wrap_memcpy(pBVar2,src,uVar4);
    }
    pBVar3 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (pBVar3 != (BufHdr *)0x0) {
      rc::RefCount::release(&pBVar3->super_RefCount);
    }
    pBVar3 = local_38.m_p;
    *(C *)((long)&(pBVar2->super_RefCount)._vptr_RefCount + length) = '\0';
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)pBVar2;
    local_38.m_p = (BufHdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr = pBVar3;
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = length;
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_isNullTerminated = true;
  }
  rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_38);
  return (C *)pBVar2;
}

Assistant:

C*
	createBuffer(
		size_t length,
		bool saveContents = false
	) {
		size_t size = (length + 1) * sizeof(C);

		if (this->m_hdr &&
			this->m_hdr->m_bufferSize >= size &&
			this->m_hdr->getRefCount() == 1) {
			if (!this->m_length || !saveContents)
				this->m_p = (C*)(this->m_hdr + 1);

			if (this->m_hdr->getLeftoverBufferSize(this->m_p) >= size) {
				this->m_length = length;
				this->m_p[length] = 0;
				this->m_isNullTerminated = true;
				return this->m_p;
			}
		}

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_EXTRA(rc::BufHdr, (bufferSize), bufferSize);
		if (!hdr)
			return NULL;

		C* p = (C*)(hdr + 1);

		if (saveContents && this->m_p) {
			size_t copyLength = AXL_MIN(length, this->m_length);
			Details::copy(p, this->m_p, copyLength);
		}

		if (this->m_hdr)
			this->m_hdr->release();

		p[length] = 0; // ensure zero termination

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_length = length;
		this->m_isNullTerminated = true;
		return p;
	}